

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O3

actor_ref * __thiscall acto::actor_ref::operator=(actor_ref *this,actor_ref *rhs)

{
  runtime_t *prVar1;
  
  if (this != rhs) {
    if (rhs->object_ != (object_t *)0x0) {
      prVar1 = core::runtime_t::instance();
      core::runtime_t::acquire(prVar1,rhs->object_);
    }
    if (this->object_ != (object_t *)0x0) {
      prVar1 = core::runtime_t::instance();
      core::runtime_t::release(prVar1,this->object_);
    }
    this->object_ = rhs->object_;
  }
  return this;
}

Assistant:

actor_ref& actor_ref::operator=(const actor_ref& rhs) {
  if (this != &rhs) {
    if (rhs.object_) {
      core::runtime_t::instance()->acquire(rhs.object_);
    }
    if (object_) {
      core::runtime_t::instance()->release(object_);
    }
    object_ = rhs.object_;
  }
  return *this;
}